

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llist.c
# Opt level: O1

void Curl_llist_insert_next(Curl_llist *list,Curl_llist_node *e,void *p,Curl_llist_node *ne)

{
  size_t sVar1;
  Curl_llist_node **ppCVar2;
  Curl_llist *pCVar3;
  
  ne->_ptr = p;
  ne->_list = list;
  sVar1 = list->_size;
  if (sVar1 == 0) {
    list->_head = ne;
    ppCVar2 = &list->_tail;
    ne->_prev = (Curl_llist_node *)0x0;
    ne->_next = (Curl_llist_node *)0x0;
  }
  else {
    ppCVar2 = &e->_next;
    pCVar3 = (Curl_llist *)ppCVar2;
    if (e == (Curl_llist_node *)0x0) {
      pCVar3 = list;
    }
    ne->_next = pCVar3->_head;
    ne->_prev = e;
    if (e == (Curl_llist_node *)0x0) {
      list->_head->_prev = ne;
      pCVar3 = list;
    }
    else if (*ppCVar2 == (Curl_llist_node *)0x0) {
      pCVar3 = (Curl_llist *)&list->_tail;
    }
    else {
      pCVar3 = (Curl_llist *)&(*ppCVar2)->_prev;
    }
    pCVar3->_head = ne;
    if (e == (Curl_llist_node *)0x0) goto LAB_00141927;
  }
  *ppCVar2 = ne;
LAB_00141927:
  list->_size = sVar1 + 1;
  return;
}

Assistant:

void
Curl_llist_insert_next(struct Curl_llist *list,
                       struct Curl_llist_node *e, /* may be NULL */
                       const void *p,
                       struct Curl_llist_node *ne)
{
  DEBUGASSERT(list);
  DEBUGASSERT(list->_init == LLISTINIT);
  DEBUGASSERT(ne);

#ifdef DEBUGBUILD
  ne->_init = NODEINIT;
#endif
  ne->_ptr = CURL_UNCONST(p);
  ne->_list = list;
  if(list->_size == 0) {
    list->_head = ne;
    list->_head->_prev = NULL;
    list->_head->_next = NULL;
    list->_tail = ne;
  }
  else {
    /* if 'e' is NULL here, we insert the new element first in the list */
    ne->_next = e ? e->_next : list->_head;
    ne->_prev = e;
    if(!e) {
      list->_head->_prev = ne;
      list->_head = ne;
    }
    else if(e->_next) {
      e->_next->_prev = ne;
    }
    else {
      list->_tail = ne;
    }
    if(e)
      e->_next = ne;
  }

  ++list->_size;
}